

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

void duckdb::NanosecondsFun::GetFunctions(void)

{
  scalar_function_t timetz_func;
  duckdb *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  ulong uVar1;
  function_statistics_t in_stack_fffffffffffffbd0;
  function_statistics_t in_stack_fffffffffffffbd8;
  code *local_400 [2];
  code *local_3f0;
  code *local_3e8;
  code *local_3e0 [2];
  code *local_3d0;
  code *local_3c8;
  LogicalType local_3c0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3a8;
  LogicalType local_390 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_378;
  LogicalType local_360 [24];
  LogicalType local_348 [24];
  code *local_330 [2];
  code *local_320;
  code *local_318;
  LogicalType local_310 [24];
  LogicalType local_2f8 [24];
  code *local_2e0 [2];
  code *local_2d0;
  code *local_2c8;
  code *local_2c0 [2];
  code *local_2b0;
  code *local_2a8;
  code *local_2a0 [2];
  code *local_290;
  code *local_288;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  duckdb::LogicalType::LogicalType(local_348,BIGINT);
  duckdb::LogicalType::LogicalType(local_360,BIGINT);
  local_330[1] = (code *)0x0;
  local_330[0] = DatePart::
                 UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::NanosecondsOperator>;
  local_318 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_320 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  local_2a0[1] = (code *)0x0;
  local_2a0[0] = ScalarFunction::
                 UnaryFunction<duckdb::interval_t,long,duckdb::DatePart::NanosecondsOperator>;
  local_288 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_290 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  local_2c0[1] = (code *)0x0;
  local_2c0[0] = ScalarFunction::
                 UnaryFunction<duckdb::dtime_t,long,duckdb::DatePart::NanosecondsOperator>;
  local_2a8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_2b0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  local_2e0[1] = (code *)0x0;
  local_2e0[0] = ScalarFunction::
                 UnaryFunction<duckdb::dtime_tz_t,long,duckdb::DatePart::NanosecondsOperator>;
  local_2c8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_2d0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  uVar1 = 0;
  timetz_func.super__Function_base._M_functor._8_8_ =
       DatePart::NanosecondsOperator::PropagateStatistics<duckdb::date_t>;
  timetz_func.super__Function_base._M_functor._M_unused._M_object = local_2e0;
  timetz_func.super__Function_base._M_manager =
       DatePart::NanosecondsOperator::PropagateStatistics<duckdb::timestamp_t>;
  timetz_func._M_invoker._0_4_ = 0x6f6106;
  timetz_func._M_invoker._4_4_ = 0;
  GetGenericTimePartFunction
            (in_RDI,local_360,(scalar_function_t *)&stack0xfffffffffffffbe0,
             (scalar_function_t *)local_330,(scalar_function_t *)local_2a0,
             (scalar_function_t *)local_2c0,timetz_func,
             DatePart::NanosecondsOperator::PropagateStatistics<duckdb::dtime_tz_t>,
             in_stack_fffffffffffffbd0,in_stack_fffffffffffffbd8,
             DatePart::UnaryFunction<duckdb::date_t,long,duckdb::DatePart::NanosecondsOperator>);
  std::_Function_base::~_Function_base((_Function_base *)local_2e0);
  std::_Function_base::~_Function_base((_Function_base *)local_2c0);
  std::_Function_base::~_Function_base((_Function_base *)local_2a0);
  std::_Function_base::~_Function_base((_Function_base *)local_330);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffbe0);
  duckdb::LogicalType::~LogicalType(local_360);
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffbe0,TIMESTAMP_NS);
  __l._M_len = 1;
  __l._M_array = (iterator)&stack0xfffffffffffffbe0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_378,__l,(allocator_type *)local_330);
  duckdb::LogicalType::LogicalType(local_390,local_348);
  local_3e0[1] = (code *)0x0;
  local_3e0[0] = DatePart::
                 UnaryFunction<duckdb::timestamp_ns_t,long,duckdb::DatePart::NanosecondsOperator>;
  local_3c8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_3d0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_2f8,INVALID);
  uVar1 = uVar1 & 0xffffffff00000000;
  duckdb::ScalarFunction::ScalarFunction
            (&local_158,&local_378,local_390,local_3e0,0,0,
             DatePart::NanosecondsOperator::PropagateStatistics<duckdb::timestamp_ns_t>,0,local_2f8,
             0,uVar1,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_158);
  ScalarFunction::~ScalarFunction(&local_158);
  duckdb::LogicalType::~LogicalType(local_2f8);
  std::_Function_base::~_Function_base((_Function_base *)local_3e0);
  duckdb::LogicalType::~LogicalType(local_390);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_378);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffbe0);
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffbe0,TIMESTAMP_TZ);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&stack0xfffffffffffffbe0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3a8,__l_00,(allocator_type *)local_330);
  duckdb::LogicalType::LogicalType(local_3c0,BIGINT);
  local_400[1] = (code *)0x0;
  local_400[0] = DatePart::
                 UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::NanosecondsOperator>;
  local_3e8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_3f0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_310,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_280,&local_3a8,local_3c0,local_400,0,0,
             DatePart::NanosecondsOperator::PropagateStatistics<duckdb::timestamp_t>,0,local_310,0,
             uVar1 & 0xffffffff00000000,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_280);
  ScalarFunction::~ScalarFunction(&local_280);
  duckdb::LogicalType::~LogicalType(local_310);
  std::_Function_base::~_Function_base((_Function_base *)local_400);
  duckdb::LogicalType::~LogicalType(local_3c0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3a8);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffbe0);
  duckdb::LogicalType::~LogicalType(local_348);
  return;
}

Assistant:

ScalarFunctionSet NanosecondsFun::GetFunctions() {
	using OP = DatePart::NanosecondsOperator;
	using TR = int64_t;
	const LogicalType &result_type = LogicalType::BIGINT;
	auto operator_set = GetTimePartFunction<OP, TR>();

	auto ns_func = DatePart::UnaryFunction<timestamp_ns_t, TR, OP>;
	auto ns_stats = OP::template PropagateStatistics<timestamp_ns_t>;
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::TIMESTAMP_NS}, result_type, ns_func, nullptr, nullptr, ns_stats));

	//	TIMESTAMP WITH TIME ZONE has the same representation as TIMESTAMP so no need to defer to ICU
	auto tstz_func = DatePart::UnaryFunction<timestamp_t, TR, OP>;
	auto tstz_stats = OP::template PropagateStatistics<timestamp_t>;
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::TIMESTAMP_TZ}, LogicalType::BIGINT, tstz_func, nullptr, nullptr, tstz_stats));

	return operator_set;
}